

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  Verbosity VVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ostream *poVar9;
  ostream **ppoVar10;
  long lVar11;
  Real RVar12;
  double dVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  size_t sVar19;
  undefined7 in_register_00000009;
  Verbosity old_verbosity;
  Verbosity VVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  Verbosity old_verbosity_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  VectorRational primal_1;
  fpclass_type local_268;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_240;
  undefined1 local_228 [16];
  pointer local_218;
  uint auStack_210 [2];
  uint local_208 [2];
  uint local_200;
  bool local_1fc;
  undefined8 local_1f8;
  data_type local_1e8;
  undefined5 local_1d8;
  char cStack_1d3;
  char cStack_1d2;
  undefined6 uStack_1d1;
  undefined3 uStack_1cb;
  uint local_1c8;
  undefined4 uStack_1c4;
  undefined5 local_1c0;
  undefined3 uStack_1bb;
  undefined8 local_1b8;
  long local_1a0;
  long local_198;
  long local_190;
  data_type local_188;
  char local_173;
  char local_172;
  uint local_168;
  void *local_160;
  char local_153;
  char local_152;
  data_type local_148;
  char local_133;
  char local_132;
  uint local_128;
  void *local_120;
  char local_113;
  char local_112;
  pointer local_108;
  pointer pnStack_100;
  pointer local_f8;
  uint auStack_f0 [2];
  uint local_e8 [4];
  pointer local_d8;
  pointer pnStack_d0;
  pointer local_c8;
  uint auStack_c0 [2];
  uint local_b8 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_198 = CONCAT44(local_198._4_4_,(int)CONCAT71(in_register_00000009,real));
  pTVar7 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
  dVar13 = log10(RVar12);
  iVar16 = (int)-dVar13;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  iVar24 = iVar16 + 10;
  if ((char)rownames != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_240,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar15 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getPrimalRay(soplex,&local_240);
    if (bVar15) {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
        (soplex->spxout).m_verbosity = VVar20;
      }
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_1a0 = (long)iVar16;
        lVar23 = 6;
        lVar21 = 0;
        do {
          local_b8._0_8_ =
               *(undefined8 *)
                (((local_240.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar23 * 2 + -4);
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -0xc;
          local_d8 = *(pointer *)puVar1;
          pnStack_d0 = *(pointer *)(puVar1 + 2);
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -8;
          local_c8 = *(pointer *)puVar1;
          auStack_c0 = *(uint (*) [2])(puVar1 + 2);
          uVar5 = ((local_240.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                  [lVar23 * 2 + -2];
          bVar4 = (byte)((local_240.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                        [lVar23 * 2 + -1];
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2;
          uVar2._0_4_ = puVar1[0];
          uVar2._4_4_ = puVar1[1];
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_208[0] = local_b8[0];
          local_208[1] = local_b8[1];
          local_218 = local_c8;
          auStack_210[0] = auStack_c0[0];
          auStack_210[1] = auStack_c0[1];
          local_228._0_8_ = local_d8;
          uVar3 = local_228._0_8_;
          local_228._8_8_ = pnStack_d0;
          local_1fc = (bool)bVar4;
          if ((bVar4 != 0) &&
             (local_228._0_4_ = SUB84(local_d8,0),
             local_228._0_4_ != 0 || (fpclass_type)uVar2 != cpp_dec_float_finite)) {
            local_1fc = (bool)(bVar4 ^ 1);
          }
          bVar15 = false;
          local_228._0_8_ = uVar3;
          local_200 = uVar5;
          local_1f8 = uVar2;
          if (((fpclass_type)uVar2 != cpp_dec_float_NaN) && (!NAN(RVar12))) {
            local_1b8 = 0xa00000000;
            local_1e8.double_first = 0;
            local_1d8 = 0;
            cStack_1d3 = '\0';
            cStack_1d2 = '\0';
            uStack_1d1 = 0;
            uStack_1cb = 0;
            local_1c8 = 0;
            uStack_1c4 = 0;
            local_1c0 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1e8.ld,RVar12);
            iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_228,
                                (cpp_dec_float<50U,_int,_void> *)&local_1e8.ld);
            bVar15 = 0 < iVar17;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if ((bVar15) && (VVar20 = (soplex->spxout).m_verbosity, 2 < (int)VVar20)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              pcVar22 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar21].idx].data;
              sVar19 = strlen(pcVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar22,sVar19);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar6 = (soplex->spxout).m_verbosity;
            ppoVar10 = (soplex->spxout).m_streams;
            poVar9 = ppoVar10[VVar6];
            lVar11 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = (long)iVar24;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_1a0;
            puVar1 = ((local_240.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar23 * 2 + -0xc;
            local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = ((local_240.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar23 * 2 + -8;
            local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_68.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)
                  (((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar23 * 2 + -4);
            local_68.m_backend.exp =
                 ((local_240.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                 [lVar23 * 2 + -2];
            local_68.m_backend.neg =
                 SUB41(((local_240.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       [lVar23 * 2 + -1],0);
            puVar1 = ((local_240.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar23 * 2;
            local_68.m_backend.fpclass = puVar1[0];
            local_68.m_backend.prec_elem = puVar1[1];
            boost::multiprecision::operator<<(ppoVar10[VVar6],&local_68);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar20;
          }
          lVar21 = lVar21 + 1;
          lVar23 = lVar23 + 7;
        } while (lVar21 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar9 + lVar21 + 0x18) = *(uint *)(poVar9 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar9 + lVar21 + 0x18) = *(uint *)(poVar9 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,").",2);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        (soplex->spxout).m_verbosity = VVar20;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 1) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0))))
            && (bVar15 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getPrimal(soplex,&local_240), bVar15)) {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
        (soplex->spxout).m_verbosity = VVar20;
      }
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        iVar17 = 0;
      }
      else {
        local_1a0 = (long)iVar24;
        local_190 = (long)iVar16;
        lVar23 = 0;
        lVar21 = 6;
        iVar17 = 0;
        do {
          local_e8._0_8_ =
               *(undefined8 *)
                (((local_240.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar21 * 2 + -4);
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -0xc;
          local_108 = *(pointer *)puVar1;
          pnStack_100 = *(pointer *)(puVar1 + 2);
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -8;
          local_f8 = *(pointer *)puVar1;
          auStack_f0 = *(uint (*) [2])(puVar1 + 2);
          uVar5 = ((local_240.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                  [lVar21 * 2 + -2];
          bVar4 = (byte)((local_240.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                        [lVar21 * 2 + -1];
          puVar1 = ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2;
          uVar3._0_4_ = puVar1[0];
          uVar3._4_4_ = puVar1[1];
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_208[0] = local_e8[0];
          local_208[1] = local_e8[1];
          local_218 = local_f8;
          auStack_210[0] = auStack_f0[0];
          auStack_210[1] = auStack_f0[1];
          local_228._0_8_ = local_108;
          uVar2 = local_228._0_8_;
          local_228._8_8_ = pnStack_100;
          local_1fc = (bool)bVar4;
          if ((bVar4 != 0) &&
             (local_228._0_4_ = SUB84(local_108,0),
             local_228._0_4_ != 0 || (fpclass_type)uVar3 != cpp_dec_float_finite)) {
            local_1fc = (bool)(bVar4 ^ 1);
          }
          bVar15 = false;
          local_228._0_8_ = uVar2;
          local_200 = uVar5;
          local_1f8 = uVar3;
          if (((fpclass_type)uVar3 != cpp_dec_float_NaN) && (!NAN(RVar12))) {
            local_1b8 = 0xa00000000;
            local_1e8.double_first = 0;
            local_1d8 = 0;
            cStack_1d3 = '\0';
            cStack_1d2 = '\0';
            uStack_1d1 = 0;
            uStack_1cb = 0;
            local_1c8 = 0;
            uStack_1c4 = 0;
            local_1c0 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1e8.ld,RVar12);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_228,
                                (cpp_dec_float<50U,_int,_void> *)&local_1e8.ld);
            bVar15 = 0 < iVar18;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if (bVar15) {
            VVar20 = (soplex->spxout).m_verbosity;
            if (2 < (int)VVar20) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (colnames->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar22 = colnames->mem +
                          (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
                sVar19 = strlen(pcVar22);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar22,sVar19);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar6 = (soplex->spxout).m_verbosity;
              ppoVar10 = (soplex->spxout).m_streams;
              poVar9 = ppoVar10[VVar6];
              lVar11 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_1a0;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_190;
              puVar1 = ((local_240.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar21 * 2 + -0xc;
              local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = ((local_240.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar21 * 2 + -8;
              local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_a8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)
                    (((local_240.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar21 * 2 + -4);
              local_a8.m_backend.exp =
                   ((local_240.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                   [lVar21 * 2 + -2];
              local_a8.m_backend.neg =
                   SUB41(((local_240.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                         [lVar21 * 2 + -1],0);
              puVar1 = ((local_240.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar21 * 2;
              local_a8.m_backend.fpclass = puVar1[0];
              local_a8.m_backend.prec_elem = puVar1[1];
              boost::multiprecision::operator<<(ppoVar10[VVar6],&local_a8);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar20;
            }
            iVar17 = iVar17 + 1;
          }
          lVar23 = lVar23 + 1;
          lVar21 = lVar21 + 7;
        } while (lVar23 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other variables are zero (within ",0x25);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar9 + lVar21 + 0x18) = *(uint *)(poVar9 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar9 + lVar21 + 0x18) = *(uint *)(poVar9 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"). Solution has ",0x10);
        std::ostream::operator<<
                  ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11
                  );
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
LAB_00136ae4:
        (soplex->spxout).m_verbosity = VVar20;
      }
    }
    else {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal information available.\n",0x21);
        goto LAB_00136ae4;
      }
    }
    if (local_240.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_240.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_240.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_198 == '\0') {
    return;
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)local_228,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar15 = ::soplex::
           SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::getPrimalRayRational
                     (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)local_228);
  if (bVar15) {
    VVar20 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
      (soplex->spxout).m_verbosity = VVar20;
    }
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_198 = (long)iVar24;
      lVar21 = 0;
      lVar23 = 0;
      do {
        uVar3 = local_228._0_8_;
        local_240.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_1e8.ld,(longlong *)&local_240,(type *)0x0);
        iVar24 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)uVar3)->m_value).num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_1e8.ld);
        if ((local_1b8._5_1_ == '\0') && (local_1b8._6_1_ == '\0')) {
          operator_delete((void *)CONCAT35(uStack_1bb,local_1c0),(ulong)local_1c8 << 3);
        }
        if ((cStack_1d3 == '\0') && (cStack_1d2 == '\0')) {
          operator_delete(local_1e8.ld.data,(ulong)local_1e8.ld.capacity << 3);
        }
        if ((iVar24 != 0) && (VVar20 = (soplex->spxout).m_verbosity, 2 < (int)VVar20)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar9 = (soplex->spxout).m_streams[3];
          if (colnames->mem == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
          }
          else {
            pcVar22 = colnames->mem +
                      (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
            sVar19 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar22,sVar19);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar11 = *(long *)poVar9;
          *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_198;
          *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = (long)iVar16;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_148.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)local_228._0_8_)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar21));
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_148.ld);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar14 = (char)poVar9;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
          std::ostream::put(cVar14);
          std::ostream::flush();
          if ((local_113 == '\0') && (local_112 == '\0')) {
            operator_delete(local_120,(ulong)local_128 << 3);
          }
          if ((local_133 == '\0') && (local_132 == '\0')) {
            operator_delete(local_148.ld.data,(ulong)local_148.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar20;
        }
        lVar23 = lVar23 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar23 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    VVar20 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
      poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar14 = (char)poVar9;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
      std::ostream::put(cVar14);
      std::ostream::flush();
      (soplex->spxout).m_verbosity = VVar20;
    }
  }
  if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 1) != 0)) ||
      ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
     (bVar15 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)local_228), bVar15)) {
    VVar20 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
      (soplex->spxout).m_verbosity = VVar20;
    }
    if ((soplex->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum < 1) {
      iVar16 = 0;
    }
    else {
      lVar21 = 0;
      lVar23 = 0;
      iVar16 = 0;
      do {
        uVar3 = local_228._0_8_;
        local_240.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_1e8.ld,(longlong *)&local_240,(type *)0x0);
        iVar24 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)uVar3)->m_value).num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_1e8.ld);
        if ((local_1b8._5_1_ == '\0') && (local_1b8._6_1_ == '\0')) {
          operator_delete((void *)CONCAT35(uStack_1bb,local_1c0),(ulong)local_1c8 << 3);
        }
        if ((cStack_1d3 == '\0') && (cStack_1d2 == '\0')) {
          operator_delete(local_1e8.ld.data,(ulong)local_1e8.ld.capacity << 3);
        }
        if (iVar24 != 0) {
          VVar20 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar20) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
            }
            else {
              pcVar22 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
              sVar19 = strlen(pcVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar22,sVar19);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_188.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                             *)local_228._0_8_)->m_value).num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar21));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_188.ld);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            if ((local_153 == '\0') && (local_152 == '\0')) {
              operator_delete(local_160,(ulong)local_168 << 3);
            }
            if ((local_173 == '\0') && (local_172 == '\0')) {
              operator_delete(local_188.ld.data,(ulong)local_188.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar20;
          }
          iVar16 = iVar16 + 1;
        }
        lVar23 = lVar23 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar23 < (soplex->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
    }
    VVar20 = (soplex->spxout).m_verbosity;
    if ((int)VVar20 < 3) goto LAB_00137246;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"All other variables are zero. Solution has ",0x2b);
    std::ostream::operator<<
              ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11);
    poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
    cVar14 = (char)poVar9;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
    std::ostream::put(cVar14);
    std::ostream::flush();
  }
  else {
    VVar20 = (soplex->spxout).m_verbosity;
    if ((int)VVar20 < 3) goto LAB_00137246;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"No primal (rational) solution available.\n",0x29);
  }
  (soplex->spxout).m_verbosity = VVar20;
LAB_00137246:
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)local_228);
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}